

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  size_type *psVar1;
  bool bVar2;
  FILE *pFVar3;
  ostream *poVar4;
  undefined8 uVar5;
  pointer pcVar6;
  char cVar7;
  undefined1 local_68 [8];
  FilePath output_dir;
  FilePath output_file_path;
  
  psVar1 = &output_file_path.pathname_._M_string_length;
  pcVar6 = (output_file->_M_dataplus)._M_p;
  output_dir.pathname_.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&output_dir.pathname_.field_2 + 8),pcVar6,
             pcVar6 + output_file->_M_string_length);
  uVar5 = output_dir.pathname_.field_2._8_8_;
  if (output_file_path.pathname_._M_dataplus._M_p != (pointer)0x0) {
    pcVar6 = (pointer)0x0;
    do {
      cVar7 = pcVar6[output_dir.pathname_.field_2._8_8_];
      if (((cVar7 != '/') || (cVar7 = '/', uVar5 == output_dir.pathname_.field_2._8_8_)) ||
         (*(char *)(uVar5 + -1) != '/')) {
        *(char *)uVar5 = cVar7;
        uVar5 = uVar5 + 1;
      }
      pcVar6 = pcVar6 + 1;
    } while (output_file_path.pathname_._M_dataplus._M_p != pcVar6);
  }
  output_file_path.pathname_._M_dataplus._M_p =
       (pointer)(uVar5 + -output_dir.pathname_.field_2._8_8_);
  *(char *)uVar5 = '\0';
  FilePath::RemoveFileName
            ((FilePath *)local_68,(FilePath *)((long)&output_dir.pathname_.field_2 + 8));
  bVar2 = FilePath::CreateDirectoriesRecursively((FilePath *)local_68);
  if (bVar2) {
    pFVar3 = fopen((output_file->_M_dataplus)._M_p,"w");
  }
  else {
    pFVar3 = (FILE *)0x0;
  }
  if (pFVar3 == (FILE *)0x0) {
    GTestLog::GTestLog((GTestLog *)((long)&output_file_path.pathname_.field_2 + 0xc),GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/googletest/googletest/src/gtest.cc"
                       ,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    GTestLog::~GTestLog((GTestLog *)((long)&output_file_path.pathname_.field_2 + 0xc));
  }
  if (local_68 != (undefined1  [8])&output_dir.pathname_._M_string_length) {
    operator_delete((void *)local_68,output_dir.pathname_._M_string_length + 1);
  }
  if ((size_type *)output_dir.pathname_.field_2._8_8_ != psVar1) {
    operator_delete((void *)output_dir.pathname_.field_2._8_8_,
                    output_file_path.pathname_._M_string_length + 1);
  }
  return (FILE *)pFVar3;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}